

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong __thiscall mkvparser::Segment::ParseHeaders(Segment *this)

{
  longlong lVar1;
  longlong lVar2;
  long lVar3;
  SegmentInfo *this_00;
  Tracks *this_01;
  Cues *this_02;
  SeekHead *this_03;
  Chapters *this_04;
  Tags *this_05;
  Tags *local_180;
  Chapters *local_170;
  SeekHead *local_160;
  Cues *local_150;
  Tracks *local_140;
  SegmentInfo *local_130;
  long local_128;
  long status_5;
  long status_4;
  long status_3;
  long status_2;
  long status_1;
  longlong element_size;
  longlong size;
  longlong id;
  longlong idpos;
  longlong result;
  long len;
  unsigned_long_long rollover_check;
  longlong element_start;
  longlong pos;
  longlong segment_stop;
  long lStack_28;
  int status;
  longlong available;
  longlong total;
  Segment *this_local;
  
  total = (longlong)this;
  segment_stop._4_4_ =
       (*this->m_pReader->_vptr_IMkvReader[1])(this->m_pReader,&available,&stack0xffffffffffffffd8);
  if (segment_stop._4_4_ < 0) {
    this_local = (Segment *)(long)segment_stop._4_4_;
  }
  else if ((available < 1) || (lStack_28 <= available)) {
    if (this->m_size < 0) {
      local_128 = -1;
    }
    else {
      local_128 = this->m_start + this->m_size;
    }
    pos = local_128;
    if ((((local_128 < 0) || (available < 0)) || (local_128 <= available)) &&
       ((local_128 < 0 || (this->m_pos <= local_128)))) {
      while (((available < 0 || (this->m_pos < available)) && ((pos < 0 || (this->m_pos < pos))))) {
        rollover_check = this->m_pos;
        len = rollover_check + 1;
        if (0x7fffffffffffffff < (ulong)len) {
          return -2;
        }
        if (lStack_28 < (long)(rollover_check + 1)) {
          return rollover_check + 1;
        }
        element_start = rollover_check;
        lVar1 = GetUIntLength(this->m_pReader,rollover_check,&result);
        if (lVar1 < 0) {
          return lVar1;
        }
        if (0 < lVar1) {
          return element_start + 1;
        }
        if ((-1 < pos) && (pos < element_start + result)) {
          return -2;
        }
        if (lStack_28 < element_start + result) {
          return element_start + result;
        }
        lVar1 = ReadID(this->m_pReader,element_start,&result);
        if (lVar1 < 0) {
          return -2;
        }
        if (lVar1 == 0x1f43b675) break;
        element_start = result + element_start;
        if (lStack_28 < element_start + 1) {
          return element_start + 1;
        }
        lVar2 = GetUIntLength(this->m_pReader,element_start,&result);
        if (lVar2 < 0) {
          return lVar2;
        }
        if (0 < lVar2) {
          return element_start + 1;
        }
        if ((-1 < pos) && (pos < element_start + result)) {
          return -2;
        }
        if (lStack_28 < element_start + result) {
          return element_start + result;
        }
        lVar2 = ReadUInt(this->m_pReader,element_start,&result);
        if (lVar2 < 0) {
          return lVar2;
        }
        if (result < 1) {
          return lVar2;
        }
        if (8 < result) {
          return lVar2;
        }
        element_start = result + element_start;
        len = lVar2 + element_start;
        if (0x7fffffffffffffff < (ulong)len) {
          return -2;
        }
        lVar3 = lVar2 + (element_start - rollover_check);
        if ((-1 < pos) && (pos < lVar2 + element_start)) {
          return -2;
        }
        if (lStack_28 < lVar2 + element_start) {
          return lVar2 + element_start;
        }
        if (lVar1 == 0x1549a966) {
          if (this->m_pInfo != (SegmentInfo *)0x0) {
            return -2;
          }
          this_00 = (SegmentInfo *)operator_new(0x50,(nothrow_t *)&std::nothrow);
          local_130 = (SegmentInfo *)0x0;
          if (this_00 != (SegmentInfo *)0x0) {
            SegmentInfo::SegmentInfo(this_00,this,element_start,lVar2,rollover_check,lVar3);
            local_130 = this_00;
          }
          this->m_pInfo = local_130;
          if (this->m_pInfo == (SegmentInfo *)0x0) {
            return -1;
          }
          lVar3 = SegmentInfo::Parse(this->m_pInfo);
joined_r0x0014e567:
          if (lVar3 != 0) {
            return lVar3;
          }
        }
        else {
          if (lVar1 == 0x1654ae6b) {
            if (this->m_pTracks != (Tracks *)0x0) {
              return -2;
            }
            this_01 = (Tracks *)operator_new(0x38,(nothrow_t *)&std::nothrow);
            local_140 = (Tracks *)0x0;
            if (this_01 != (Tracks *)0x0) {
              Tracks::Tracks(this_01,this,element_start,lVar2,rollover_check,lVar3);
              local_140 = this_01;
            }
            this->m_pTracks = local_140;
            if (this->m_pTracks == (Tracks *)0x0) {
              return -1;
            }
            lVar3 = Tracks::Parse(this->m_pTracks);
            goto joined_r0x0014e567;
          }
          if (lVar1 == 0x1c53bb6b) {
            if (this->m_pCues == (Cues *)0x0) {
              this_02 = (Cues *)operator_new(0x48,(nothrow_t *)&std::nothrow);
              local_150 = (Cues *)0x0;
              if (this_02 != (Cues *)0x0) {
                Cues::Cues(this_02,this,element_start,lVar2,rollover_check,lVar3);
                local_150 = this_02;
              }
              this->m_pCues = local_150;
              if (this->m_pCues == (Cues *)0x0) {
                return -1;
              }
            }
          }
          else if (lVar1 == 0x114d9b74) {
            if (this->m_pSeekHead == (SeekHead *)0x0) {
              this_03 = (SeekHead *)operator_new(0x48,(nothrow_t *)&std::nothrow);
              local_160 = (SeekHead *)0x0;
              if (this_03 != (SeekHead *)0x0) {
                SeekHead::SeekHead(this_03,this,element_start,lVar2,rollover_check,lVar3);
                local_160 = this_03;
              }
              this->m_pSeekHead = local_160;
              if (this->m_pSeekHead == (SeekHead *)0x0) {
                return -1;
              }
              lVar3 = SeekHead::Parse(this->m_pSeekHead);
              goto joined_r0x0014e567;
            }
          }
          else if (lVar1 == 0x1043a770) {
            if (this->m_pChapters == (Chapters *)0x0) {
              this_04 = (Chapters *)operator_new(0x38,(nothrow_t *)&std::nothrow);
              local_170 = (Chapters *)0x0;
              if (this_04 != (Chapters *)0x0) {
                Chapters::Chapters(this_04,this,element_start,lVar2,rollover_check,lVar3);
                local_170 = this_04;
              }
              this->m_pChapters = local_170;
              if (this->m_pChapters == (Chapters *)0x0) {
                return -1;
              }
              lVar3 = Chapters::Parse(this->m_pChapters);
              goto joined_r0x0014e567;
            }
          }
          else if ((lVar1 == 0x1254c367) && (this->m_pTags == (Tags *)0x0)) {
            this_05 = (Tags *)operator_new(0x38,(nothrow_t *)&std::nothrow);
            local_180 = (Tags *)0x0;
            if (this_05 != (Tags *)0x0) {
              Tags::Tags(this_05,this,element_start,lVar2,rollover_check,lVar3);
              local_180 = this_05;
            }
            this->m_pTags = local_180;
            if (this->m_pTags == (Tags *)0x0) {
              return -1;
            }
            lVar3 = Tags::Parse(this->m_pTags);
            goto joined_r0x0014e567;
          }
        }
        this->m_pos = lVar2 + element_start;
      }
      if ((pos < 0) || (this->m_pos <= pos)) {
        if (this->m_pInfo == (SegmentInfo *)0x0) {
          this_local = (Segment *)0xfffffffffffffffe;
        }
        else if (this->m_pTracks == (Tracks *)0x0) {
          this_local = (Segment *)0xfffffffffffffffe;
        }
        else {
          this_local = (Segment *)0x0;
        }
      }
      else {
        this_local = (Segment *)0xfffffffffffffffe;
      }
    }
    else {
      this_local = (Segment *)0xfffffffffffffffe;
    }
  }
  else {
    this_local = (Segment *)0xfffffffffffffffe;
  }
  return (longlong)this_local;
}

Assistant:

long long Segment::ParseHeaders() {
  // Outermost (level 0) segment object has been constructed,
  // and pos designates start of payload.  We need to find the
  // inner (level 1) elements.
  long long total, available;

  const int status = m_pReader->Length(&total, &available);

  if (status < 0)  // error
    return status;

  if (total > 0 && available > total)
    return E_FILE_FORMAT_INVALID;

  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  if ((segment_stop >= 0 && total >= 0 && segment_stop > total) ||
      (segment_stop >= 0 && m_pos > segment_stop)) {
    return E_FILE_FORMAT_INVALID;
  }

  for (;;) {
    if ((total >= 0) && (m_pos >= total))
      break;

    if ((segment_stop >= 0) && (m_pos >= segment_stop))
      break;

    long long pos = m_pos;
    const long long element_start = pos;

    // Avoid rolling over pos when very close to LLONG_MAX.
    unsigned long long rollover_check = pos + 1ULL;
    if (rollover_check > LLONG_MAX)
      return E_FILE_FORMAT_INVALID;

    if ((pos + 1) > available)
      return (pos + 1);

    long len;
    long long result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return result;

    if (result > 0) {
      // MkvReader doesn't have enough data to satisfy this read attempt.
      return (pos + 1);
    }

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    const long long idpos = pos;
    const long long id = ReadID(m_pReader, idpos, len);

    if (id < 0)
      return E_FILE_FORMAT_INVALID;

    if (id == libwebm::kMkvCluster)
      break;

    pos += len;  // consume ID

    if ((pos + 1) > available)
      return (pos + 1);

    // Read Size
    result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return result;

    if (result > 0) {
      // MkvReader doesn't have enough data to satisfy this read attempt.
      return (pos + 1);
    }

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    const long long size = ReadUInt(m_pReader, pos, len);

    if (size < 0 || len < 1 || len > 8) {
      // TODO(tomfinegan): ReadUInt should return an error when len is < 1 or
      // len > 8 is true instead of checking this _everywhere_.
      return size;
    }

    pos += len;  // consume length of size of element

    // Avoid rolling over pos when very close to LLONG_MAX.
    rollover_check = static_cast<unsigned long long>(pos) + size;
    if (rollover_check > LLONG_MAX)
      return E_FILE_FORMAT_INVALID;

    const long long element_size = size + pos - element_start;

    // Pos now points to start of payload

    if ((segment_stop >= 0) && ((pos + size) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    // We read EBML elements either in total or nothing at all.

    if ((pos + size) > available)
      return pos + size;

    if (id == libwebm::kMkvInfo) {
      if (m_pInfo)
        return E_FILE_FORMAT_INVALID;

      m_pInfo = new (std::nothrow)
          SegmentInfo(this, pos, size, element_start, element_size);

      if (m_pInfo == NULL)
        return -1;

      const long status = m_pInfo->Parse();

      if (status)
        return status;
    } else if (id == libwebm::kMkvTracks) {
      if (m_pTracks)
        return E_FILE_FORMAT_INVALID;

      m_pTracks = new (std::nothrow)
          Tracks(this, pos, size, element_start, element_size);

      if (m_pTracks == NULL)
        return -1;

      const long status = m_pTracks->Parse();

      if (status)
        return status;
    } else if (id == libwebm::kMkvCues) {
      if (m_pCues == NULL) {
        m_pCues = new (std::nothrow)
            Cues(this, pos, size, element_start, element_size);

        if (m_pCues == NULL)
          return -1;
      }
    } else if (id == libwebm::kMkvSeekHead) {
      if (m_pSeekHead == NULL) {
        m_pSeekHead = new (std::nothrow)
            SeekHead(this, pos, size, element_start, element_size);

        if (m_pSeekHead == NULL)
          return -1;

        const long status = m_pSeekHead->Parse();

        if (status)
          return status;
      }
    } else if (id == libwebm::kMkvChapters) {
      if (m_pChapters == NULL) {
        m_pChapters = new (std::nothrow)
            Chapters(this, pos, size, element_start, element_size);

        if (m_pChapters == NULL)
          return -1;

        const long status = m_pChapters->Parse();

        if (status)
          return status;
      }
    } else if (id == libwebm::kMkvTags) {
      if (m_pTags == NULL) {
        m_pTags = new (std::nothrow)
            Tags(this, pos, size, element_start, element_size);

        if (m_pTags == NULL)
          return -1;

        const long status = m_pTags->Parse();

        if (status)
          return status;
      }
    }

    m_pos = pos + size;  // consume payload
  }

  if (segment_stop >= 0 && m_pos > segment_stop)
    return E_FILE_FORMAT_INVALID;

  if (m_pInfo == NULL)  // TODO: liberalize this behavior
    return E_FILE_FORMAT_INVALID;

  if (m_pTracks == NULL)
    return E_FILE_FORMAT_INVALID;

  return 0;  // success
}